

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.cpp
# Opt level: O2

void __thiscall PSBTOutput::FillSignatureData(PSBTOutput *this,SignatureData *sigdata)

{
  map<CKeyID,_std::pair<CPubKey,_KeyOriginInfo>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
  *this_00;
  _Base_ptr __args;
  uint uVar1;
  long lVar2;
  pointer ptVar3;
  uchar *puVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  TaprootSpendData other;
  bool bVar8;
  _Base_ptr p_Var9;
  uint uVar10;
  type *script;
  pointer ptVar11;
  long in_FS_OFFSET;
  Span<const_unsigned_char> script_00;
  undefined8 in_stack_fffffffffffffe68;
  XOnlyPubKey *this_01;
  XOnlyPubKey *pXVar12;
  SignatureData *pSVar13;
  undefined1 in_stack_fffffffffffffe80 [88];
  TaprootSpendData spenddata;
  TaprootBuilder builder;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = (this->redeem_script).super_CScriptBase._size;
  uVar10 = uVar1 - 0x1d;
  if (uVar1 < 0x1d) {
    uVar10 = uVar1;
  }
  if (uVar10 != 0) {
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              (&(sigdata->redeem_script).super_CScriptBase,
               (prevector<28U,_unsigned_char,_unsigned_int,_int> *)this);
  }
  uVar1 = (this->witness_script).super_CScriptBase._size;
  uVar10 = uVar1 - 0x1d;
  if (uVar1 < 0x1d) {
    uVar10 = uVar1;
  }
  if (uVar10 != 0) {
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              (&(sigdata->witness_script).super_CScriptBase,
               &(this->witness_script).super_CScriptBase);
  }
  this_00 = &sigdata->misc_pubkeys;
  for (p_Var9 = (this->hd_keypaths)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var9 != &(this->hd_keypaths)._M_t._M_impl.super__Rb_tree_header;
      p_Var9 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var9)) {
    CPubKey::GetID((CKeyID *)&spenddata,(CPubKey *)(p_Var9 + 1));
    std::
    _Rb_tree<CKeyID,std::pair<CKeyID_const,std::pair<CPubKey,KeyOriginInfo>>,std::_Select1st<std::pair<CKeyID_const,std::pair<CPubKey,KeyOriginInfo>>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,std::pair<CPubKey,KeyOriginInfo>>>>
    ::_M_emplace_unique<CKeyID,std::pair<CPubKey_const,KeyOriginInfo>const&>
              ((_Rb_tree<CKeyID,std::pair<CKeyID_const,std::pair<CPubKey,KeyOriginInfo>>,std::_Select1st<std::pair<CKeyID_const,std::pair<CPubKey,KeyOriginInfo>>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,std::pair<CPubKey,KeyOriginInfo>>>>
                *)this_00,(CKeyID *)&spenddata,(pair<const_CPubKey,_KeyOriginInfo> *)(p_Var9 + 1));
  }
  if ((this->m_tap_tree).
      super__Vector_base<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->m_tap_tree).
      super__Vector_base<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    this_01 = &this->m_tap_internal_key;
    pSVar13 = sigdata;
    bVar8 = XOnlyPubKey::IsFullyValid(this_01);
    if (bVar8) {
      builder.m_valid = true;
      builder.m_branch.
      super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      builder.m_branch.
      super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      builder.m_branch.
      super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0] = '\0';
      builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[1] = '\0';
      builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[2] = '\0';
      builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[3] = '\0';
      builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[4] = '\0';
      builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[5] = '\0';
      builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[6] = '\0';
      builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[7] = '\0';
      builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[8] = '\0';
      builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[9] = '\0';
      builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[10] = '\0';
      builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
      builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
      builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
      builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
      builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
      builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
      builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
      builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
      builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
      builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
      builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
      builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
      builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
      builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
      builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
      builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
      builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
      builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
      builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
      builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
      builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
      builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0] = '\0';
      builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[1] = '\0';
      builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[2] = '\0';
      builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[3] = '\0';
      builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[4] = '\0';
      builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[5] = '\0';
      builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[6] = '\0';
      builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[7] = '\0';
      builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[8] = '\0';
      builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[9] = '\0';
      builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[10] = '\0';
      builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
      builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
      builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
      builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
      builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
      builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
      builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
      builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
      builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
      builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
      builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
      builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
      builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
      builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
      builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
      builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
      builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
      builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
      builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
      builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
      builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
      ptVar3 = (this->m_tap_tree).
               super__Vector_base<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (ptVar11 = (this->m_tap_tree).
                     super__Vector_base<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; ptVar11 != ptVar3;
          ptVar11 = ptVar11 + 1) {
        puVar4 = *(uchar **)
                  &(ptVar11->
                   super__Tuple_impl<0UL,_unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   ).
                   super__Tuple_impl<1UL,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   .
                   super__Tuple_impl<2UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   .
                   super__Head_base<2UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false>
                   ._M_head_impl.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl;
        script_00.m_size =
             (long)*(pointer *)
                    ((long)&(ptVar11->
                            super__Tuple_impl<0UL,_unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            ).
                            super__Tuple_impl<1UL,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            .
                            super__Tuple_impl<2UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            .
                            super__Head_base<2UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false>
                            ._M_head_impl.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl + 8) - (long)puVar4;
        script_00.m_data = puVar4;
        TaprootBuilder::Add(&builder,(uint)(byte)(ptVar11->
                                                 super__Tuple_impl<0UL,_unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                 ).
                                                 super__Tuple_impl<1UL,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                 .field_0x19,script_00,
                            (uint)(ptVar11->
                                  super__Tuple_impl<0UL,_unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                  ).
                                  super__Tuple_impl<1UL,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                  .super__Head_base<1UL,_unsigned_char,_false>._M_head_impl,true);
      }
      bVar8 = TaprootBuilder::IsComplete(&builder);
      if (!bVar8) {
        __assert_fail("builder.IsComplete()",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/psbt.cpp"
                      ,0xf1,"void PSBTOutput::FillSignatureData(SignatureData &) const");
      }
      pXVar12 = this_01;
      TaprootBuilder::Finalize(&builder,this_01);
      TaprootBuilder::GetSpendData(&spenddata,&builder);
      uVar5 = *(undefined8 *)(this_01->m_keydata).super_base_blob<256U>.m_data._M_elems;
      uVar6 = *(undefined8 *)((this_01->m_keydata).super_base_blob<256U>.m_data._M_elems + 8);
      uVar7 = *(undefined8 *)((this_01->m_keydata).super_base_blob<256U>.m_data._M_elems + 0x18);
      *(undefined8 *)
       ((sigdata->tr_spenddata).internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems + 0x10)
           = *(undefined8 *)((this_01->m_keydata).super_base_blob<256U>.m_data._M_elems + 0x10);
      *(undefined8 *)
       ((sigdata->tr_spenddata).internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems + 0x18)
           = uVar7;
      *(undefined8 *)
       (sigdata->tr_spenddata).internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems = uVar5;
      *(undefined8 *)
       ((sigdata->tr_spenddata).internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems + 8) =
           uVar6;
      TaprootSpendData::TaprootSpendData((TaprootSpendData *)&stack0xfffffffffffffe80,&spenddata);
      other.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems._8_8_ = pXVar12;
      other.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0] =
           (char)in_stack_fffffffffffffe68;
      other.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[1] =
           (char)((ulong)in_stack_fffffffffffffe68 >> 8);
      other.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[2] =
           (char)((ulong)in_stack_fffffffffffffe68 >> 0x10);
      other.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[3] =
           (char)((ulong)in_stack_fffffffffffffe68 >> 0x18);
      other.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[4] =
           (char)((ulong)in_stack_fffffffffffffe68 >> 0x20);
      other.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[5] =
           (char)((ulong)in_stack_fffffffffffffe68 >> 0x28);
      other.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[6] =
           (char)((ulong)in_stack_fffffffffffffe68 >> 0x30);
      other.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[7] =
           (char)((ulong)in_stack_fffffffffffffe68 >> 0x38);
      other.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems._16_8_ = pSVar13;
      other.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x18] =
           in_stack_fffffffffffffe80[0];
      other.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x19] =
           in_stack_fffffffffffffe80[1];
      other.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1a] =
           in_stack_fffffffffffffe80[2];
      other.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1b] =
           in_stack_fffffffffffffe80[3];
      other.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1c] =
           in_stack_fffffffffffffe80[4];
      other.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1d] =
           in_stack_fffffffffffffe80[5];
      other.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1e] =
           in_stack_fffffffffffffe80[6];
      other.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1f] =
           in_stack_fffffffffffffe80[7];
      other.merkle_root.super_base_blob<256U>.m_data._M_elems =
           (base_blob<256U>)(base_blob<256U>)in_stack_fffffffffffffe80._8_32_;
      other.scripts._M_t._M_impl = (_Rep_type)(_Rep_type)in_stack_fffffffffffffe80._40_48_;
      TaprootSpendData::Merge(&sigdata->tr_spenddata,other);
      std::
      _Rb_tree<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_std::_Select1st<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_std::_Select1st<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
                   *)&stack0xfffffffffffffec0);
      std::
      _Rb_tree<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_std::_Select1st<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
      ::~_Rb_tree(&spenddata.scripts._M_t);
      std::
      vector<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
      ::~vector(&builder.m_branch);
    }
  }
  for (p_Var9 = (this->m_tap_bip32_paths)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var9 != &(this->m_tap_bip32_paths)._M_t._M_impl.super__Rb_tree_header;
      p_Var9 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var9)) {
    __args = p_Var9 + 1;
    std::
    _Rb_tree<XOnlyPubKey,std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>,std::_Select1st<std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>>,std::less<XOnlyPubKey>,std::allocator<std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>>>
    ::
    _M_emplace_unique<XOnlyPubKey_const&,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>const&>
              ((_Rb_tree<XOnlyPubKey,std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>,std::_Select1st<std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>>,std::less<XOnlyPubKey>,std::allocator<std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>>>
                *)&sigdata->taproot_misc_pubkeys,(XOnlyPubKey *)__args,
               (pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>
                *)(p_Var9 + 2));
    Hash160<XOnlyPubKey>((uint160 *)&spenddata,(XOnlyPubKey *)__args);
    std::
    _Rb_tree<CKeyID,std::pair<CKeyID_const,XOnlyPubKey>,std::_Select1st<std::pair<CKeyID_const,XOnlyPubKey>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,XOnlyPubKey>>>
    ::_M_emplace_unique<uint160,XOnlyPubKey_const&>
              ((_Rb_tree<CKeyID,std::pair<CKeyID_const,XOnlyPubKey>,std::_Select1st<std::pair<CKeyID_const,XOnlyPubKey>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,XOnlyPubKey>>>
                *)&sigdata->tap_pubkeys,(uint160 *)&spenddata,(XOnlyPubKey *)__args);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void PSBTOutput::FillSignatureData(SignatureData& sigdata) const
{
    if (!redeem_script.empty()) {
        sigdata.redeem_script = redeem_script;
    }
    if (!witness_script.empty()) {
        sigdata.witness_script = witness_script;
    }
    for (const auto& key_pair : hd_keypaths) {
        sigdata.misc_pubkeys.emplace(key_pair.first.GetID(), key_pair);
    }
    if (!m_tap_tree.empty() && m_tap_internal_key.IsFullyValid()) {
        TaprootBuilder builder;
        for (const auto& [depth, leaf_ver, script] : m_tap_tree) {
            builder.Add((int)depth, script, (int)leaf_ver, /*track=*/true);
        }
        assert(builder.IsComplete());
        builder.Finalize(m_tap_internal_key);
        TaprootSpendData spenddata = builder.GetSpendData();

        sigdata.tr_spenddata.internal_key = m_tap_internal_key;
        sigdata.tr_spenddata.Merge(spenddata);
    }
    for (const auto& [pubkey, leaf_origin] : m_tap_bip32_paths) {
        sigdata.taproot_misc_pubkeys.emplace(pubkey, leaf_origin);
        sigdata.tap_pubkeys.emplace(Hash160(pubkey), pubkey);
    }
}